

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O3

void __thiscall
SharedMutexTest_TryLockFail_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>_>
::TestBody(SharedMutexTest_TryLockFail_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>_>
           *this)

{
  undefined8 *puVar1;
  bool bVar2;
  char *in_R9;
  join_thread thd;
  barrier step;
  TypeParam mtx;
  AssertHelper local_140;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  thread local_130;
  internal local_128 [8];
  undefined8 *local_120;
  undefined1 local_118 [32];
  barrier local_f8;
  shared_mutex_base<yamc::rwlock::WriterPrefer> local_88;
  
  local_f8.nthread_ = 2;
  local_f8.count_ = 2;
  local_f8.step_ = 0;
  std::condition_variable::condition_variable(&local_f8.cv_);
  local_f8.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_f8.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_f8.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_f8.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_f8.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  local_88.state_.nwriter = 0;
  local_88.state_.nreader = 0;
  std::condition_variable::condition_variable(&local_88.cv_);
  local_88.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_88.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_88.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_88.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_88.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  local_118._0_8_ = &local_88;
  local_118._8_8_ = &local_f8;
  std::thread::
  thread<SharedMutexTest_TryLockFail_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>>::TestBody()::_lambda()_1_,,void>
            (&local_130,(anon_class_16_2_20c777b2_for__M_head_impl *)local_118);
  yamc::test::barrier::await(&local_f8);
  bVar2 = yamc::alternate::detail::shared_mutex_base<yamc::rwlock::WriterPrefer>::try_lock
                    (&local_88);
  local_128[0] = (internal)!bVar2;
  local_120 = (undefined8 *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,local_128,(AssertionResult *)"mtx.try_lock()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x82,(char *)local_118._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((shared_mutex_base<yamc::rwlock::WriterPrefer> *)local_118._0_8_ !=
        (shared_mutex_base<yamc::rwlock::WriterPrefer> *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_);
    }
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
    puVar1 = local_120;
    if (local_120 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_120 != local_120 + 2) {
        operator_delete((undefined8 *)*local_120);
      }
      operator_delete(puVar1);
    }
  }
  yamc::test::barrier::await(&local_f8);
  yamc::test::join_thread::~join_thread((join_thread *)&local_130);
  std::condition_variable::~condition_variable(&local_88.cv_);
  std::condition_variable::~condition_variable(&local_f8.cv_);
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  // reader-thread
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock_shared());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock_shared());
  });
  // writer-thread
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}